

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O3

lock_handle<int,_std::timed_mutex> * __thiscall
gmlc::libguarded::
try_lock_handle_until<int,std::timed_mutex,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (lock_handle<int,_std::timed_mutex> *__return_storage_ptr__,libguarded *this,int *obj,
          timed_mutex *gmutex,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  long lVar1;
  int iVar2;
  unique_lock<std::timed_mutex> *this_00;
  unique_lock<std::timed_mutex> local_58;
  unique_lock<std::timed_mutex> local_48;
  unique_lock<std::timed_mutex> local_38;
  
  lVar1 = (gmutex->super___mutex_base)._M_mutex.__align;
  local_58._M_device = (mutex_type *)(lVar1 / 1000000000);
  local_58._8_8_ = lVar1 % 1000000000;
  iVar2 = pthread_mutex_clocklock(obj,1,&local_58);
  local_58._M_device = (mutex_type *)0x0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  if (iVar2 == 0) {
    this_00 = &local_38;
    local_38._M_device = (mutex_type *)0x0;
  }
  else {
    this_00 = &local_48;
    local_48._M_device = (mutex_type *)0x0;
    this = (libguarded *)0x0;
  }
  this_00->_M_owns = false;
  std::unique_lock<std::timed_mutex>::~unique_lock(this_00);
  __return_storage_ptr__->data = (pointer)this;
  (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)obj;
  (__return_storage_ptr__->m_handle_lock)._M_owns = iVar2 == 0;
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_58);
  return __return_storage_ptr__;
}

Assistant:

lock_handle<T, M> try_lock_handle_until(T* obj, M& gmutex, const TimePoint& tp)
{
    typename lock_handle<T, M>::lock_type glock(gmutex, tp);
    if (glock.owns_lock()) {
        return lock_handle<T, M>(obj, std::move(glock));
    } else {
        return lock_handle<T, M>(nullptr, std::move(glock));
    }
}